

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

bool __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::rd_string
          (uintwide_t<256U,_unsigned_short,_void,_true> *this,char *str_input,
          unsigned_fast_type count,int base_hint)

{
  ushort *puVar1;
  short *psVar2;
  ushort uVar3;
  representation_type *prVar4;
  byte bVar5;
  ushort uVar6;
  uint uVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  uintwide_t<256U,_unsigned_short,_void,_true> local_58;
  
  prVar4 = &this->values;
  (prVar4->super_array<unsigned_short,_16UL>).elems[8] = 0;
  (prVar4->super_array<unsigned_short,_16UL>).elems[9] = 0;
  (prVar4->super_array<unsigned_short,_16UL>).elems[10] = 0;
  (prVar4->super_array<unsigned_short,_16UL>).elems[0xb] = 0;
  prVar4 = &this->values;
  (prVar4->super_array<unsigned_short,_16UL>).elems[0xc] = 0;
  (prVar4->super_array<unsigned_short,_16UL>).elems[0xd] = 0;
  (prVar4->super_array<unsigned_short,_16UL>).elems[0xe] = 0;
  (prVar4->super_array<unsigned_short,_16UL>).elems[0xf] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[0] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[1] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[2] = 0;
  (this->values).super_array<unsigned_short,_16UL>.elems[3] = 0;
  prVar4 = &this->values;
  (prVar4->super_array<unsigned_short,_16UL>).elems[4] = 0;
  (prVar4->super_array<unsigned_short,_16UL>).elems[5] = 0;
  (prVar4->super_array<unsigned_short,_16UL>).elems[6] = 0;
  (prVar4->super_array<unsigned_short,_16UL>).elems[7] = 0;
  if (count == 0xffffffffffffffff) {
    if (*str_input == '\0') {
      count = 0;
    }
    else {
      uVar10 = 0;
      do {
        count = uVar10 + 1;
        lVar9 = uVar10 + 1;
        uVar10 = count;
      } while (str_input[lVar9] != '\0');
    }
  }
  uVar10 = 0;
  if (count != 0) {
    uVar10 = (ulong)(*str_input == '+');
  }
  bVar12 = false;
  if (count != 0) {
    bVar12 = *str_input == '-';
    uVar10 = uVar10 + bVar12;
  }
  if ((((char)base_hint == '\0') && (base_hint = 10, uVar10 < count)) && (str_input[uVar10] == '0'))
  {
    if ((byte)(str_input[uVar10 + 1] - 0x30U) < 9) {
      uVar10 = uVar10 + 1;
      base_hint = 8;
    }
    else if ((byte)(str_input[uVar10 + 1] | 0x20U) == 0x78) {
      uVar10 = uVar10 + 2;
      base_hint = 0x10;
    }
  }
  bVar11 = true;
  if (uVar10 < count) {
    do {
      bVar5 = str_input[uVar10];
      if (bVar5 != 0x27) {
        if ((char)base_hint == '\x10') {
          bVar8 = bVar5 - 0x30;
          bVar11 = (bVar8 < 10 || (byte)(bVar5 + 0xbf) < 6) || (byte)(bVar5 + 0x9f) < 6;
          if ((bVar8 < 10) ||
             ((bVar5 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar5 - 0x41) & 0x3f) & 1) != 0)))
             ) {
            if ((byte)(bVar5 + 0x9f) < 6) {
              bVar5 = bVar5 + 0xa9;
            }
            else if ((byte)(bVar5 + 0xbf) < 6) {
              bVar5 = bVar5 - 0x37;
            }
            else {
              bVar5 = bVar5 - 0x30;
              if (9 < bVar8) {
                bVar5 = 0;
              }
            }
            uVar6 = 0;
            lVar9 = 0;
            do {
              uVar3 = *(ushort *)
                       ((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar9);
              *(ushort *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar9) =
                   uVar6 | uVar3 << 4;
              lVar9 = lVar9 + 2;
              uVar6 = uVar3 >> 0xc;
            } while (lVar9 != 0x20);
LAB_0012413b:
            (this->values).super_array<unsigned_short,_16UL>.elems[0] =
                 (this->values).super_array<unsigned_short,_16UL>.elems[0] | (ushort)bVar5;
          }
        }
        else if ((base_hint & 0xffU) == 10) {
          bVar11 = (byte)(bVar5 - 0x30) < 10;
          if (bVar11) {
            lVar9 = 0;
            uVar7 = 0;
            do {
              uVar6 = (this->values).super_array<unsigned_short,_16UL>.elems[lVar9];
              uVar7 = uVar7 + ((uint)uVar6 + (uint)uVar6 * 4) * 2;
              (this->values).super_array<unsigned_short,_16UL>.elems[lVar9] =
                   (value_type_conflict3)uVar7;
              uVar7 = uVar7 >> 0x10;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x10);
            local_58.values.super_array<unsigned_short,_16UL>.elems[4] = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems[5] = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems[6] = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems[7] = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems[8] = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems[9] = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems[10] = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems[0xb] = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems._1_7_ = 0;
            local_58.values.super_array<unsigned_short,_16UL>.elems[0]._0_1_ = bVar5 - 0x30;
            operator+=(this,&local_58);
          }
        }
        else if ((base_hint & 0xffU) == 8) {
          bVar5 = bVar5 - 0x30;
          bVar11 = bVar5 < 9;
          if (bVar11) {
            uVar6 = 0;
            lVar9 = 0;
            do {
              uVar3 = *(ushort *)
                       ((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar9);
              *(ushort *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar9) =
                   uVar6 | uVar3 * 8;
              lVar9 = lVar9 + 2;
              uVar6 = uVar3 >> 0xd;
            } while (lVar9 != 0x20);
            goto LAB_0012413b;
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while ((uVar10 < count) && (bVar11 != false));
  }
  if (bVar12) {
    lVar9 = 0;
    do {
      puVar1 = (ushort *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar9);
      *puVar1 = ~*puVar1;
      lVar9 = lVar9 + 2;
    } while (lVar9 != 0x20);
    lVar9 = 0;
    do {
      psVar2 = (short *)((long)(this->values).super_array<unsigned_short,_16UL>.elems + lVar9);
      *psVar2 = *psVar2 + 1;
      if (*psVar2 != 0) {
        return bVar11;
      }
      bVar12 = lVar9 != 0x1e;
      lVar9 = lVar9 + 2;
    } while (bVar12);
  }
  return bVar11;
}

Assistant:

constexpr auto rd_string(const char* str_input, const unsigned_fast_type count, const int base_hint) -> bool // NOLINT(readability-function-cognitive-complexity,bugprone-easily-swappable-parameters)
    {
      detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0)));

      const auto str_length =
        static_cast<unsigned_fast_type>
        (
          (count == (std::numeric_limits<unsigned_fast_type>::max)()) ? detail::strlen_unsafe(str_input) : count
        );

      auto pos = static_cast<unsigned_fast_type>(UINT8_C(0));

      // Detect: Is there a plus sign?
      // And if there is a plus sign, skip over the plus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '+')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        ++pos;
      }

      auto str_has_neg_sign = false;

      // Detect: Is there a minus sign?
      // And if there is a minus sign, skip over the minus sign.
      if((str_length > static_cast<unsigned_fast_type>(UINT8_C(0))) && (str_input[static_cast<std::size_t>(UINT8_C(0))] == '-')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
      {
        str_has_neg_sign = true;

        ++pos;
      }

      // Set the base if the client has supplied a non-zero base-hint.
      auto base = static_cast<std::uint_fast8_t>(base_hint);

      if(base == static_cast<std::uint_fast8_t>(UINT8_C(0)))
      {
        base = static_cast<std::uint_fast8_t>(UINT8_C(10));

        // Perform a dynamic detection of the base.
        if(str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))
        {
          const auto might_be_oct_or_hex = ((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] == '0') && (str_length > static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0))))); // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

          if(might_be_oct_or_hex)
          {
            if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] <= '8')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is octal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(8));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)));
            }
            else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'x') || (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(1)))] == 'X')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
            {
              // The input format is hexadecimal.
              base = static_cast<std::uint_fast8_t>(UINT8_C(16));

              pos = static_cast<unsigned_fast_type>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(2)));
            }
          }
          else if((str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] >= '0') && (str_input[static_cast<std::size_t>(static_cast<std::size_t>(pos) + static_cast<std::size_t>(UINT8_C(0)))] <= '9')) // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)
          {
            // The input format is decimal.
            ;
          }
        }
      }

      auto char_is_valid = true;

      while((pos < str_length) && char_is_valid) // NOLINT(altera-id-dependent-backward-branch)
      {
        const auto c = str_input[pos++]; // NOLINT(cppcoreguidelines-pro-bounds-pointer-arithmetic)

        const auto char_is_apostrophe = (c == static_cast<char>(39));

        if(!char_is_apostrophe)
        {
          if(base == static_cast<std::uint_fast8_t>(UINT8_C(8)))
          {
            char_is_valid = ((c >= '0') && (c <= '8'));

            if(char_is_valid)
            {
              const auto uc_oct = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(3))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_oct);
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(10)))
          {
            char_is_valid = ((c >= '0') && (c <= '9'));

            if(char_is_valid)
            {
              const auto uc_dec = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30)));

              static_cast<void>(mul_by_limb(static_cast<limb_type>(UINT8_C(10))));

              static_cast<void>(operator+=(uc_dec));
            }
          }
          else if(base == static_cast<std::uint_fast8_t>(UINT8_C(16)))
          {
            const auto char_is_a_to_f_lo((c >= 'a') && (c <= 'f'));
            const auto char_is_a_to_f_hi((c >= 'A') && (c <= 'F'));
            const auto char_is_0_to_9   ((c >= '0') && (c <= '9'));

            char_is_valid = (char_is_a_to_f_lo || char_is_a_to_f_hi || char_is_0_to_9);

            if(char_is_valid)
            {
              auto uc_hex = static_cast<std::uint8_t>(UINT8_C(0));

              if     (char_is_a_to_f_lo) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  87))); }
              else if(char_is_a_to_f_hi) { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(  55))); }
              else if(char_is_0_to_9)    { uc_hex = static_cast<std::uint8_t>(c - static_cast<char>(UINT8_C(0x30))); }

              static_cast<void>(operator<<=(static_cast<unsigned>(UINT8_C(4))));

              *values.begin() = static_cast<limb_type>(*values.begin() | uc_hex);
            }
          }
        }
      }

      if(str_has_neg_sign)
      {
        // Exclude this line from code coverage, even though explicit
        // test cases (search for "result_overshift_is_ok") are known
        // to cover this line.
        negate(); // LCOV_EXCL_LINE
      }

      return char_is_valid;
    }